

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

int __thiscall
SubCircuit<0>::chooseEvidenceVar(SubCircuit<0> *this,vec<int> *options,int selectionMethod)

{
  IntVar *pIVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  uniform_int_distribution<int> rnd_option;
  int local_44;
  uniform_int_distribution<int> local_38;
  
  uVar6 = options->sz;
  if (selectionMethod != 1 && uVar6 != 1) {
    switch(selectionMethod) {
    case 2:
      piVar7 = options->data;
      uVar6 = uVar6 - 1;
      break;
    case 3:
      pIVar1 = this->x[*options->data].var;
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar1,(long)*options->data,1);
      local_44 = *options->data;
      if (options->sz == 0) {
        return local_44;
      }
      iVar3 = sat.trailpos.data[(uint)(iVar3 >> 1)];
      uVar8 = 0;
      do {
        pIVar1 = this->x[*options->data].var;
        iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar1,(long)*options->data,1);
        iVar4 = sat.trailpos.data[(uint)(iVar4 >> 1)];
        pIVar1 = this->x[*options->data].var;
        iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar1,(long)*options->data,0);
        if (iVar4 != sat.trailpos.data[(uint)(iVar5 >> 1)]) {
          chooseEvidenceVar();
        }
        iVar4 = options->data[uVar8];
        pIVar1 = this->x[iVar4].var;
        iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,(long)iVar4,1);
        if (iVar3 < sat.trailpos.data[(uint)(iVar5 >> 1)]) {
          iVar3 = sat.trailpos.data[(uint)(iVar5 >> 1)];
          local_44 = iVar4;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < options->sz);
      return local_44;
    case 4:
      pIVar1 = this->x[*options->data].var;
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar1,(long)*options->data,1);
      local_44 = *options->data;
      if (options->sz == 0) {
        return local_44;
      }
      iVar3 = sat.trailpos.data[(uint)(iVar3 >> 1)];
      uVar8 = 0;
      do {
        iVar4 = options->data[uVar8];
        pIVar1 = this->x[iVar4].var;
        uVar6 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,(long)iVar4,1);
        iVar5 = sat.trailpos.data[(uint)((int)uVar6 >> 1)];
        if ((iVar5 < iVar3) && (iVar3 = iVar5, local_44 = iVar4, iVar5 == 0)) {
          cVar2 = -sat.assigns.data[(uint)((int)uVar6 >> 1)];
          if ((uVar6 & 1) == 0) {
            cVar2 = sat.assigns.data[(uint)((int)uVar6 >> 1)];
          }
          if (cVar2 != -1) {
            chooseEvidenceVar();
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < options->sz);
      return local_44;
    default:
      piVar7 = options->data;
      goto LAB_00143911;
    case 6:
      local_38._M_param._M_b = uVar6 - 1;
      local_38._M_param._M_a = 0;
      uVar6 = std::uniform_int_distribution<int>::operator()
                        (&local_38,&engine.rnd,&local_38._M_param);
      piVar7 = options->data;
      uVar6 = piVar7[uVar6];
    }
    return piVar7[uVar6];
  }
  piVar7 = options->data;
LAB_00143911:
  return *piVar7;
}

Assistant:

int chooseEvidenceVar(vec<int> options, int selectionMethod) {
		if (options.size() == 1 || selectionMethod == 1) {
			// fprintf(stderr, "option 2 chose %d\n", options[0]);
			//  1 is the first
			return options[0];
		}
		if (selectionMethod == 2) {
			// fprintf(stderr, "option 1 chose %d\n", options[1]);
			//  the last
			return options.last();
		}
		/*   else if(selectionMethod == 3)
			 {
					 // highest activity
					 double highestAct = 0;
					 int bestVar = options[0];
					 for(int i = 0; i < options.size(); i++)
					 {
								int v = options[i];
								Lit p = x[v].getLit(v, LR_NE);
								int satvar = var(p);
							if(sat.activity[satvar] > highestAct)
							{
									 highestAct = sat.activity[satvar];
									 bestVar = v;
							}
					 }
					 return bestVar;
			 }
			 else if(selectionMethod == 4)
			 {
					 // lowest activity
					 double lowestAct = sat.activity[var(x[options[0]].getLit(options[0], LR_NE))];
					 int bestVar = options[0];
					 for(int i = 1; i < options.size(); i++)
					 {
								int v = options[i];
								Lit p = x[v].getLit(v, LR_NE);
								int satvar = var(p);
							if(sat.activity[satvar] < lowestAct)
							{
									 lowestAct = sat.activity[satvar];
									 bestVar = v;
							}
					 }
					 return bestVar;
			 }*/
		if (selectionMethod == 3) {
			// highest level
			// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
			// Maybe it should be replaced by sat.getLevel(.)?
			int highestLevel = sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))];
			// int highestLevel = sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ)));
			int bestVar = options[0];
			for (unsigned int i = 0; i < options.size(); i++) {
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))] !=
						sat.trailpos[var(x[options[0]].getLit(options[0], LR_NE))]) {
					// if(sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ))) !=
					// sat.getLevel(var(x[options[0]].getLit(options[0], LR_NE))))
					fprintf(stderr, "not same\n");
				}
				const int v = options[i];
				const Lit p = x[v].getLit(v, LR_EQ);
				const int satvar = var(p);
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[satvar] > highestLevel)
				// if(sat.getLevel(satvar) > highestLevel)
				{
					// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
					// Maybe it should be replaced by sat.getLevel(.)?
					highestLevel = sat.trailpos[satvar];
					// highestLevel = sat.getLevel(satvar);
					bestVar = v;
				}
			}
			return bestVar;
		}
		if (selectionMethod == 4) {
			// lowest level
			// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
			// Maybe it should be replaced by sat.getLevel(.)?
			int lowestLevel = sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))];
			// int lowestLevel = sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ)));
			int bestVar = options[0];
			for (unsigned int i = 0; i < options.size(); i++) {
				const int v = options[i];
				const Lit p = x[v].getLit(v, LR_EQ);
				const int satvar = var(p);
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[satvar] < lowestLevel)
				// if(sat.getLevel(satvar) < lowestLevel)
				{
					// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
					// Maybe it should be replaced by sat.getLevel(.)?
					lowestLevel = sat.trailpos[satvar];
					// lowestLevel = sat.getLevel(satvar);
					if (lowestLevel == 0 && (sat.value(p) != l_False)) {
						fprintf(stderr, "level 0 not fixed\n");
					}
					bestVar = v;
				}
			}
			return bestVar;
		}
		if (selectionMethod == 6) {
			// fprintf(stderr, "random\n");
			std::uniform_int_distribution<int> rnd_option(0, options.size() - 1);
			const int bestIndex = options[rnd_option(engine.rnd)];
			return options[bestIndex];
		}
		return options[0];
		fprintf(stderr, "unexpected evidence type\n");
	}